

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# text_format.cc
# Opt level: O3

bool __thiscall google::protobuf::TextFormat::Parser::ParserImpl::SkipField(ParserImpl *this)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  size_t sVar2;
  long *plVar3;
  bool bVar4;
  int iVar5;
  _Alloc_hider _Var6;
  string field_name;
  string local_b0;
  string local_90;
  string local_70;
  long *local_50;
  size_t local_48;
  long local_40 [2];
  
  local_70._M_string_length = 0;
  local_70.field_2._M_local_buf[0] = '\0';
  paVar1 = &local_b0.field_2;
  local_b0._M_dataplus._M_p = (pointer)paVar1;
  local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_b0,"[","");
  bVar4 = TryConsume(this,&local_b0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_b0._M_dataplus._M_p != paVar1) {
    operator_delete(local_b0._M_dataplus._M_p,local_b0.field_2._M_allocated_capacity + 1);
  }
  if (bVar4) {
    bVar4 = ConsumeFullTypeName(this,&local_70);
    if (bVar4) {
      local_b0._M_dataplus._M_p = (pointer)paVar1;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_b0,"]","");
      bVar4 = Consume(this,&local_b0);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_b0._M_dataplus._M_p != paVar1) {
        operator_delete(local_b0._M_dataplus._M_p,local_b0.field_2._M_allocated_capacity + 1);
      }
      if (bVar4) goto LAB_005c76df;
    }
  }
  else {
    bVar4 = ConsumeIdentifier(this,&local_70);
    if (bVar4) {
LAB_005c76df:
      local_b0._M_dataplus._M_p = (pointer)paVar1;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_b0,":","");
      bVar4 = TryConsume(this,&local_b0);
      if (bVar4) {
        local_90._M_dataplus._M_p = (pointer)&local_90.field_2;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_90,"{","");
        _Var6._M_p = local_90._M_dataplus._M_p;
        sVar2 = (this->tokenizer_).current_.text._M_string_length;
        if ((sVar2 == local_90._M_string_length) &&
           ((sVar2 == 0 ||
            (iVar5 = bcmp((this->tokenizer_).current_.text._M_dataplus._M_p,
                          local_90._M_dataplus._M_p,sVar2), iVar5 == 0)))) {
          bVar4 = false;
        }
        else {
          local_50 = local_40;
          std::__cxx11::string::_M_construct<char_const*>((string *)&local_50,"<","");
          plVar3 = local_50;
          sVar2 = (this->tokenizer_).current_.text._M_string_length;
          if (sVar2 == local_48) {
            if (sVar2 == 0) {
              bVar4 = false;
            }
            else {
              iVar5 = bcmp((this->tokenizer_).current_.text._M_dataplus._M_p,local_50,sVar2);
              bVar4 = iVar5 != 0;
            }
          }
          else {
            bVar4 = true;
          }
          _Var6._M_p = local_90._M_dataplus._M_p;
          if (plVar3 != local_40) {
            operator_delete(plVar3,local_40[0] + 1);
            _Var6._M_p = local_90._M_dataplus._M_p;
          }
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)_Var6._M_p != &local_90.field_2) {
          operator_delete(_Var6._M_p,local_90.field_2._M_allocated_capacity + 1);
        }
      }
      else {
        bVar4 = false;
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_b0._M_dataplus._M_p != paVar1) {
        operator_delete(local_b0._M_dataplus._M_p,local_b0.field_2._M_allocated_capacity + 1);
      }
      if (bVar4) {
        bVar4 = SkipFieldValue(this);
      }
      else {
        bVar4 = SkipFieldMessage(this);
      }
      if (bVar4 != false) {
        local_b0._M_dataplus._M_p = (pointer)paVar1;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_b0,";","");
        bVar4 = TryConsume(this,&local_b0);
        if (!bVar4) {
          local_90._M_dataplus._M_p = (pointer)&local_90.field_2;
          std::__cxx11::string::_M_construct<char_const*>((string *)&local_90,",","");
          TryConsume(this,&local_90);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_90._M_dataplus._M_p != &local_90.field_2) {
            operator_delete(local_90._M_dataplus._M_p,local_90.field_2._M_allocated_capacity + 1);
          }
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_b0._M_dataplus._M_p != paVar1) {
          operator_delete(local_b0._M_dataplus._M_p,local_b0.field_2._M_allocated_capacity + 1);
        }
        bVar4 = true;
        goto LAB_005c78ab;
      }
    }
  }
  bVar4 = false;
LAB_005c78ab:
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70._M_dataplus._M_p != &local_70.field_2) {
    operator_delete(local_70._M_dataplus._M_p,
                    CONCAT71(local_70.field_2._M_allocated_capacity._1_7_,
                             local_70.field_2._M_local_buf[0]) + 1);
  }
  return bVar4;
}

Assistant:

bool SkipField() {
    string field_name;
    if (TryConsume("[")) {
      // Extension name.
      DO(ConsumeFullTypeName(&field_name));
      DO(Consume("]"));
    } else {
      DO(ConsumeIdentifier(&field_name));
    }

    // Try to guess the type of this field.
    // If this field is not a message, there should be a ":" between the
    // field name and the field value and also the field value should not
    // start with "{" or "<" which indicates the beginning of a message body.
    // If there is no ":" or there is a "{" or "<" after ":", this field has
    // to be a message or the input is ill-formed.
    if (TryConsume(":") && !LookingAt("{") && !LookingAt("<")) {
      DO(SkipFieldValue());
    } else {
      DO(SkipFieldMessage());
    }
    // For historical reasons, fields may optionally be separated by commas or
    // semicolons.
    TryConsume(";") || TryConsume(",");
    return true;
  }